

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  secp256k1_scalar *in_RSI;
  int overflow;
  secp256k1_scalar term;
  secp256k1_scalar *in_stack_00000070;
  secp256k1_ge *in_stack_00000078;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar1;
  int iVar2;
  uint in_stack_ffffffffffffffec;
  
  iVar2 = 0;
  secp256k1_scalar_set_b32
            (in_RSI,(uchar *)((ulong)in_stack_ffffffffffffffec << 0x20),
             (int *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  bVar1 = false;
  if (iVar2 == 0) {
    iVar2 = secp256k1_eckey_pubkey_tweak_add(in_stack_00000078,in_stack_00000070);
    bVar1 = iVar2 != 0;
  }
  return (int)bVar1;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}